

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptFunction::IsScriptFunction(JavascriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x5f,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  return (BOOL)((pFVar4->functionBodyImpl).ptr != (FunctionProxy *)0x0);
}

Assistant:

BOOL JavascriptFunction::IsScriptFunction() const
    {
        Assert(functionInfo != nullptr);
        return functionInfo->HasBody();
    }